

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * Json::codePointToUTF8_abi_cxx11_(uint cp)

{
  byte *pbVar1;
  uint in_ESI;
  string *in_RDI;
  string *result;
  undefined1 local_c;
  
  std::__cxx11::string::string((string *)in_RDI);
  local_c = (byte)in_ESI;
  if (in_ESI < 0x80) {
    std::__cxx11::string::resize((ulong)in_RDI);
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = local_c;
  }
  else if (in_ESI < 0x800) {
    std::__cxx11::string::resize((ulong)in_RDI);
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = local_c & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = (byte)(in_ESI >> 6) & 0x1f | 0xc0;
  }
  else if (in_ESI < 0x10000) {
    std::__cxx11::string::resize((ulong)in_RDI);
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = local_c & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = (byte)(in_ESI >> 6) & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = (byte)(in_ESI >> 0xc) & 0xf | 0xe0;
  }
  else if (in_ESI < 0x110000) {
    std::__cxx11::string::resize((ulong)in_RDI);
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = local_c & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = (byte)(in_ESI >> 6) & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = (byte)(in_ESI >> 0xc) & 0x3f | 0x80;
    pbVar1 = (byte *)std::__cxx11::string::operator[]((ulong)in_RDI);
    *pbVar1 = (byte)(in_ESI >> 0x12) & 7 | 0xf0;
  }
  return in_RDI;
}

Assistant:

static inline JSONCPP_STRING codePointToUTF8(unsigned int cp) {
  JSONCPP_STRING result;

  // based on description from http://en.wikipedia.org/wiki/UTF-8

  if (cp <= 0x7f) {
    result.resize(1);
    result[0] = static_cast<char>(cp);
  } else if (cp <= 0x7FF) {
    result.resize(2);
    result[1] = static_cast<char>(0x80 | (0x3f & cp));
    result[0] = static_cast<char>(0xC0 | (0x1f & (cp >> 6)));
  } else if (cp <= 0xFFFF) {
    result.resize(3);
    result[2] = static_cast<char>(0x80 | (0x3f & cp));
    result[1] = static_cast<char>(0x80 | (0x3f & (cp >> 6)));
    result[0] = static_cast<char>(0xE0 | (0xf & (cp >> 12)));
  } else if (cp <= 0x10FFFF) {
    result.resize(4);
    result[3] = static_cast<char>(0x80 | (0x3f & cp));
    result[2] = static_cast<char>(0x80 | (0x3f & (cp >> 6)));
    result[1] = static_cast<char>(0x80 | (0x3f & (cp >> 12)));
    result[0] = static_cast<char>(0xF0 | (0x7 & (cp >> 18)));
  }

  return result;
}